

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDetect.c
# Opt level: O2

int Abc_NtkFinCheckTypesOk(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Abc_Obj_t *pNode;
  int iVar2;
  int i;
  
  i = 0;
  while ((iVar2 = 0, i < pNtk->vObjs->nSize &&
         (((pNode = Abc_NtkObj(pNtk,i), pNode == (Abc_Obj_t *)0x0 ||
           ((*(uint *)&pNode->field_0x14 & 0xf) != 7)) ||
          (iVar1 = Abc_ObjFinGateType(pNode), iVar2 = i, iVar1 != -100))))) {
    i = i + 1;
  }
  return iVar2;
}

Assistant:

int Abc_NtkFinCheckTypesOk( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj; int i;
    Abc_NtkForEachNode( pNtk, pObj, i )
        if ( Abc_ObjFinGateType(pObj) == ABC_FIN_NONE )
            return i;
    return 0;
}